

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

void __thiscall MidiApi::error(MidiApi *this,Type type,string *errorString)

{
  ostream *poVar1;
  RtMidiError *this_00;
  undefined1 local_40 [8];
  string errorMessage;
  string *errorString_local;
  Type type_local;
  MidiApi *this_local;
  
  errorMessage.field_2._8_8_ = errorString;
  if (this->errorCallback_ == (RtMidiErrorCallback)0x0) {
    if (type == WARNING) {
      poVar1 = std::operator<<((ostream *)&std::cerr,'\n');
      poVar1 = std::operator<<(poVar1,(string *)errorString);
      std::operator<<(poVar1,"\n\n");
    }
    else if (type != DEBUG_WARNING) {
      poVar1 = std::operator<<((ostream *)&std::cerr,'\n');
      poVar1 = std::operator<<(poVar1,(string *)errorString);
      std::operator<<(poVar1,"\n\n");
      this_00 = (RtMidiError *)__cxa_allocate_exception(0x30);
      RtMidiError::RtMidiError(this_00,errorString,type);
      __cxa_throw(this_00,&RtMidiError::typeinfo,RtMidiError::~RtMidiError);
    }
  }
  else if ((this->firstErrorOccurred_ & 1U) == 0) {
    this->firstErrorOccurred_ = true;
    std::__cxx11::string::string((string *)local_40,(string *)errorString);
    (*this->errorCallback_)(type,(string *)local_40,this->errorCallbackUserData_);
    this->firstErrorOccurred_ = false;
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void MidiApi :: error( RtMidiError::Type type, std::string errorString )
{
  if ( errorCallback_ ) {

    if ( firstErrorOccurred_ )
      return;

    firstErrorOccurred_ = true;
    const std::string errorMessage = errorString;

    errorCallback_( type, errorMessage, errorCallbackUserData_ );
    firstErrorOccurred_ = false;
    return;
  }

  if ( type == RtMidiError::WARNING ) {
    std::cerr << '\n' << errorString << "\n\n";
  }
  else if ( type == RtMidiError::DEBUG_WARNING ) {
#if defined(__RTMIDI_DEBUG__)
    std::cerr << '\n' << errorString << "\n\n";
#endif
  }
  else {
    std::cerr << '\n' << errorString << "\n\n";
    throw RtMidiError( errorString, type );
  }
}